

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::changeRowsBounds
          (Highs *this,HighsInt num_set_entries,HighsInt *set,double *lower,double *upper)

{
  HighsLogOptions *log_options;
  Highs *this_00;
  bool bVar1;
  bool bVar2;
  HighsInt create_error;
  HighsStatus HVar3;
  allocator local_211;
  Highs *local_210;
  vector<int,_std::allocator<int>_> local_set;
  vector<double,_std::allocator<double>_> local_upper;
  vector<double,_std::allocator<double>_> local_lower;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  HighsIndexCollection index_collection;
  HighsLogOptions local_f0;
  HighsLogOptions local_90;
  
  if (num_set_entries == 0) {
    return kOk;
  }
  std::__cxx11::string::string
            ((string *)&local_160,"row lower bounds",(allocator *)&index_collection);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  local_210 = this;
  bVar1 = doubleUserDataNotNull(log_options,lower,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string
            ((string *)&local_180,"row upper bounds",(allocator *)&index_collection);
  bVar2 = doubleUserDataNotNull(log_options,upper,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  if (bVar1 || bVar2) {
    return kError;
  }
  clearDerivedModelProperties(local_210);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_lower,lower,lower + num_set_entries,
             (allocator_type *)&index_collection);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_upper,upper,upper + num_set_entries,
             (allocator_type *)&index_collection);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_set,set,set + num_set_entries,
             (allocator_type *)&index_collection);
  sortSetData(num_set_entries,&local_set,lower,upper,(double *)0x0,
              local_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,
              local_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,(double *)0x0);
  this_00 = local_210;
  index_collection.dimension_ = -1;
  index_collection.is_interval_ = false;
  index_collection.from_ = -1;
  index_collection.to_ = -2;
  index_collection.is_set_ = false;
  index_collection.set_num_entries_ = -1;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  index_collection._41_8_ = 0;
  create_error = create(&index_collection,num_set_entries,
                        local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,(local_210->model_).lp_.num_row_);
  if (create_error == 0) {
    HVar3 = changeRowBoundsInterface
                      (this_00,&index_collection,
                       local_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
    HighsLogOptions::HighsLogOptions(&local_f0,log_options);
    std::__cxx11::string::string((string *)&local_1c0,"changeRowBounds",&local_211);
    HVar3 = interpretCallStatus(&local_f0,HVar3,kOk,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::_Function_base::~_Function_base(&local_f0.user_callback.super__Function_base);
    if (HVar3 != kError) {
      HVar3 = returnFromHighs(local_210,HVar3);
      goto LAB_00239218;
    }
  }
  else {
    HighsLogOptions::HighsLogOptions(&local_90,log_options);
    std::__cxx11::string::string((string *)&local_1a0,"changeRowsBounds",(allocator *)&local_1c0);
    analyseSetCreateError
              (&local_90,&local_1a0,create_error,true,num_set_entries,
               local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,(this_00->model_).lp_.num_row_);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  }
  HVar3 = kError;
LAB_00239218:
  HighsIndexCollection::~HighsIndexCollection(&index_collection);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_set.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_lower.super__Vector_base<double,_std::allocator<double>_>);
  return HVar3;
}

Assistant:

HighsStatus Highs::changeRowsBounds(const HighsInt num_set_entries,
                                    const HighsInt* set, const double* lower,
                                    const double* upper) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  // Check for NULL data in "set" version of changeRowsBounds since
  // values are sorted with set
  bool null_data = false;
  null_data =
      doubleUserDataNotNull(options_.log_options, lower, "row lower bounds") ||
      null_data;
  null_data =
      doubleUserDataNotNull(options_.log_options, upper, "row upper bounds") ||
      null_data;
  if (null_data) return HighsStatus::kError;
  clearDerivedModelProperties();
  // Ensure that the set and data are in ascending order
  std::vector<double> local_lower{lower, lower + num_set_entries};
  std::vector<double> local_upper{upper, upper + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, lower, upper, NULL,
              local_lower.data(), local_upper.data(), NULL);
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_row_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeRowsBounds",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_row_);
  HighsStatus call_status = changeRowBoundsInterface(
      index_collection, local_lower.data(), local_upper.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeRowBounds");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}